

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O1

void __thiscall spvtools::opt::RegisterLiveness::Analyze(RegisterLiveness *this,Function *f)

{
  IRContext *pIVar1;
  pointer puVar2;
  BasicBlock *pBVar3;
  pointer ppLVar4;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_00;
  Instruction *pIVar5;
  pointer pOVar6;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var7;
  RegisterLiveness *pRVar8;
  bool bVar9;
  char cVar10;
  uint32_t uVar11;
  int32_t iVar12;
  RegionRegisterLiveness *pRVar13;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var14;
  size_type sVar15;
  Instruction *pIVar16;
  pointer pOVar17;
  pointer puVar18;
  pointer ppLVar19;
  _Hash_node_base *p_Var20;
  size_t reg_count;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  die_in_block;
  size_type local_108;
  ComputeRegisterLiveness local_100;
  undefined8 **local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *pcStack_b0;
  undefined8 *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  code *pcStack_90;
  pointer local_88;
  pointer local_80;
  Instruction *local_78;
  undefined8 local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined4 local_48;
  undefined8 local_40;
  RegisterLiveness *pRStack_38;
  
  std::__detail::
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>_>_>
  ::_M_deallocate_nodes
            ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>_>_>
              *)&this->block_pressure_,
             (__node_ptr)(this->block_pressure_)._M_h._M_before_begin._M_nxt);
  memset((this->block_pressure_)._M_h._M_buckets,0,(this->block_pressure_)._M_h._M_bucket_count << 3
        );
  (this->block_pressure_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_pressure_)._M_h._M_element_count = 0;
  pIVar1 = this->context_;
  local_100.reg_pressure_ = this;
  local_100.context_ = pIVar1;
  local_100.function_ = f;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
  }
  local_100.cfg_ =
       (pIVar1->cfg_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
       super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  local_100.def_use_manager_ =
       (pIVar1->def_use_mgr_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_100.dom_tree_ = (DominatorTree *)IRContext::GetDominatorAnalysis(this->context_,f);
  local_100.loop_desc_ = IRContext::GetLoopDescriptor(this->context_,f);
  puVar18 = ((local_100.function_)->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = ((local_100.function_)->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar18 != puVar2) {
    do {
      pRVar8 = local_100.reg_pressure_;
      pBVar3 = (puVar18->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      pIVar16 = (pBVar3->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar11 = 0;
      if (pIVar16->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(pIVar16,(uint)pIVar16->has_type_id_);
      }
      pRVar13 = Get(pRVar8,uVar11);
      if (pRVar13 == (RegionRegisterLiveness *)0x0) {
        local_68._8_8_ = 0;
        local_68._M_unused._M_object = &local_100;
        pcStack_50 = std::
                     _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:84:47)>
                     ::_M_invoke;
        local_58 = std::
                   _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:84:47)>
                   ::_M_manager;
        CFG::ForEachBlockInPostOrder
                  (local_100.cfg_,pBVar3,(function<void_(spvtools::opt::BasicBlock_*)> *)&local_68);
        if (local_58 != (code *)0x0) {
          (*local_58)(&local_68,&local_68,3);
        }
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar2);
  }
  ppLVar19 = ((local_100.loop_desc_)->placeholder_top_loop_).nested_loops_.
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar4 = ((local_100.loop_desc_)->placeholder_top_loop_).nested_loops_.
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar19 != ppLVar4) {
    do {
      anon_unknown_8::ComputeRegisterLiveness::DoLoopLivenessUnification(&local_100,*ppLVar19);
      ppLVar19 = ppLVar19 + 1;
    } while (ppLVar19 != ppLVar4);
  }
  local_80 = ((local_100.function_)->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_88 = ((local_100.function_)->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_80 != local_88) {
    do {
      pRVar8 = local_100.reg_pressure_;
      pBVar3 = (local_80->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      this_00.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (pBVar3->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ;
      uVar11 = 0;
      if (*(bool *)((long)this_00.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x2d) == true) {
        uVar11 = Instruction::GetSingleWordOperand
                           ((Instruction *)
                            this_00.
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl
                            ,(uint)*(bool *)((long)this_00.
                                                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                                  .
                                                  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                                  ._M_head_impl + 0x2c));
      }
      pRVar13 = Get(pRVar8,uVar11);
      if (pRVar13 == (RegionRegisterLiveness *)0x0) {
        __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0xd6,
                      "void spvtools::opt::(anonymous namespace)::ComputeRegisterLiveness::EvaluateRegisterRequirements()"
                     );
      }
      local_108 = (pRVar13->live_out_)._M_h._M_element_count;
      for (p_Var20 = (pRVar13->live_out_)._M_h._M_before_begin._M_nxt;
          p_Var20 != (_Hash_node_base *)0x0; p_Var20 = p_Var20->_M_nxt) {
        RegionRegisterLiveness::AddRegisterClass(pRVar13,(Instruction *)p_Var20[1]._M_nxt);
      }
      pRVar13->used_registers_ = local_108;
      local_68._M_unused._M_object = &pRStack_38;
      local_68._8_8_ = 1;
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_48 = 0x3f800000;
      local_40 = 0;
      pRStack_38 = (RegisterLiveness *)0x0;
      local_78 = *(Instruction **)
                  ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
      pIVar16 = (Instruction *)
                ((long)&(pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
      if (pIVar16 != local_78) {
        do {
          pIVar5 = (pIVar16->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
          if (pIVar5->opcode_ == OpPhi) break;
          local_98 = (code *)0x0;
          pcStack_90 = (code *)0x0;
          local_a8 = (undefined8 *)0x0;
          uStack_a0 = 0;
          local_a8 = (undefined8 *)operator_new(0x20);
          *local_a8 = pRVar13;
          local_a8[1] = &local_68;
          local_a8[2] = &local_108;
          local_a8[3] = &local_100;
          pcStack_90 = std::
                       _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:231:13)>
                       ::_M_invoke;
          local_98 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:231:13)>
                     ::_M_manager;
          uStack_c0 = 0;
          local_c8 = &local_a8;
          pcStack_b0 = std::
                       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                       ::_M_invoke;
          local_b8 = std::
                     _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                     ::_M_manager;
          pOVar6 = *(pointer *)
                    ((long)&(pIVar5->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    + 8);
          for (pOVar17 = *(pointer *)
                          &(pIVar5->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl; pOVar17 != pOVar6; pOVar17 = pOVar17 + 1) {
            bVar9 = spvIsInIdType(pOVar17->type);
            if (bVar9) {
              _Var7._M_head_impl =
                   *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    &(pOVar17->words).large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ;
              _Var14._M_head_impl =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &(pOVar17->words).small_data_;
              if ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )_Var7._M_head_impl !=
                  (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                   )0x0) {
                _Var14._M_head_impl = _Var7._M_head_impl;
              }
              local_70 = *(undefined8 *)_Var14._M_head_impl;
              if (local_b8 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              cVar10 = (*pcStack_b0)(&local_c8);
              if (cVar10 == '\0') break;
            }
          }
          if (local_b8 != (code *)0x0) {
            (*local_b8)(&local_c8,&local_c8,3);
          }
          if (local_98 != (code *)0x0) {
            (*local_98)(&local_a8,&local_a8,3);
          }
          sVar15 = local_108;
          if (local_108 < pRVar13->used_registers_) {
            sVar15 = pRVar13->used_registers_;
          }
          pRVar13->used_registers_ = sVar15;
          if ((pIVar5->has_result_id_ == true) && (pIVar5->opcode_ != OpUndef)) {
            iVar12 = spvOpcodeIsConstant(pIVar5->opcode_);
            if ((iVar12 == 0) && (pIVar5->opcode_ != OpLabel)) {
              local_108 = local_108 - 1;
            }
          }
          pIVar16 = (pIVar16->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        } while (pIVar16 != local_78);
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&local_68);
      local_80 = local_80 + 1;
    } while (local_80 != local_88);
  }
  return;
}

Assistant:

void RegisterLiveness::Analyze(Function* f) {
  block_pressure_.clear();
  ComputeRegisterLiveness(this, f).Compute();
}